

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::AssertionStack::Print(AssertionStack *this,DebugWriter *w,Matcher *matcher)

{
  AssertionInfo *this_00;
  undefined1 local_28 [8];
  Iterator it;
  
  local_28 = (undefined1  [8])
             (this->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
             super_ContinuousPageStack<1UL>.nextTop;
  it.super_Iterator.nextTop = (size_t)this;
  while (local_28 != (undefined1  [8])0x0) {
    this_00 = ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>::Iterator::
              operator*((Iterator *)local_28);
    AssertionInfo::Print(this_00,w);
    ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>::Iterator::operator++
              ((Iterator *)local_28);
  }
  return;
}

Assistant:

void AssertionStack::Print(DebugWriter* w, const Matcher* matcher) const
    {
        for (Iterator it(*this); it; ++it)
        {
            it->Print(w);
        }
    }